

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_buffer_encoder.c
# Opt level: O1

lzma_ret block_buffer_encode(lzma_block *block,lzma_allocator *allocator,uint8_t *in,size_t in_size,
                            uint8_t *out,size_t *out_pos,size_t out_size,_Bool try_to_compress)

{
  lzma_check type;
  ulong uVar1;
  lzma_bool lVar2;
  uint32_t uVar3;
  lzma_ret lVar4;
  lzma_vli lVar5;
  ulong uVar6;
  long lVar7;
  size_t out_size_00;
  ulong __n;
  lzma_check_state check;
  lzma_check_state local_98;
  
  if (((block != (lzma_block *)0x0) &&
      ((out_pos != (size_t *)0x0 && out != (uint8_t *)0x0) && (in_size == 0 || in != (uint8_t *)0x0)
      )) && (uVar6 = *out_pos, uVar6 <= out_size)) {
    if (1 < block->version) {
      return LZMA_OPTIONS_ERROR;
    }
    type = block->check;
    if (type < 0x10) {
      if ((try_to_compress) && (block->filters == (lzma_filter *)0x0)) {
        return LZMA_PROG_ERROR;
      }
      lVar2 = lzma_check_is_supported(type);
      if (lVar2 == '\0') {
        return LZMA_UNSUPPORTED_CHECK;
      }
      uVar3 = lzma_check_size(type);
      if (uVar3 == 0xffffffff) {
        __assert_fail("check_size != UINT32_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/block_buffer_encoder.c"
                      ,0xfd,
                      "lzma_ret block_buffer_encode(lzma_block *, const lzma_allocator *, const uint8_t *, size_t, uint8_t *, size_t *, size_t, _Bool)"
                     );
      }
      lVar7 = out_size - ((int)out_size - (int)uVar6 & 3);
      __n = (ulong)uVar3;
      lVar4 = LZMA_BUF_ERROR;
      if (lVar7 - uVar6 <= __n) {
        return LZMA_BUF_ERROR;
      }
      block->uncompressed_size = in_size;
      if (in_size < 0x7ffffffffffffbbd) {
        uVar6 = in_size + 0xffff >> 0x10;
        lVar5 = 0;
        if (in_size <= uVar6 * -3 + 0x7ffffffffffffbbb) {
          lVar5 = in_size + 1 + uVar6 * 3;
        }
      }
      else {
        lVar5 = 0;
      }
      block->compressed_size = lVar5;
      if (lVar5 == 0) {
        return LZMA_DATA_ERROR;
      }
      out_size_00 = lVar7 - __n;
      if (try_to_compress) {
        lVar4 = block_encode_normal(block,allocator,in,in_size,out,out_pos,out_size_00);
      }
      if (lVar4 != LZMA_OK) {
        if (lVar4 != LZMA_BUF_ERROR) {
          return lVar4;
        }
        lVar4 = block_encode_uncompressed(block,in,in_size,out,out_pos,out_size_00);
        if (lVar4 != LZMA_OK) {
          return lVar4;
        }
      }
      if (out_size_00 < *out_pos) {
        __assert_fail("*out_pos <= out_size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/block_buffer_encoder.c"
                      ,0x121,
                      "lzma_ret block_buffer_encode(lzma_block *, const lzma_allocator *, const uint8_t *, size_t, uint8_t *, size_t *, size_t, _Bool)"
                     );
      }
      uVar6 = block->compressed_size;
      while ((uVar6 & 3) != 0) {
        uVar6 = uVar6 + 1;
        uVar1 = *out_pos;
        if (out_size_00 <= uVar1) {
          __assert_fail("*out_pos < out_size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/block_buffer_encoder.c"
                        ,0x127,
                        "lzma_ret block_buffer_encode(lzma_block *, const lzma_allocator *, const uint8_t *, size_t, uint8_t *, size_t *, size_t, _Bool)"
                       );
        }
        *out_pos = uVar1 + 1;
        out[uVar1] = '\0';
      }
      if (__n == 0) {
        return LZMA_OK;
      }
      lzma_check_init(&local_98,block->check);
      lzma_check_update(&local_98,block->check,in,in_size);
      lzma_check_finish(&local_98,block->check);
      memcpy(block->raw_check,&local_98,__n);
      memcpy(out + *out_pos,&local_98,__n);
      *out_pos = *out_pos + __n;
      return LZMA_OK;
    }
  }
  return LZMA_PROG_ERROR;
}

Assistant:

static lzma_ret
block_buffer_encode(lzma_block *block, const lzma_allocator *allocator,
		const uint8_t *in, size_t in_size,
		uint8_t *out, size_t *out_pos, size_t out_size,
		bool try_to_compress)
{
	// Validate the arguments.
	if (block == NULL || (in == NULL && in_size != 0) || out == NULL
			|| out_pos == NULL || *out_pos > out_size)
		return LZMA_PROG_ERROR;

	// The contents of the structure may depend on the version so
	// check the version before validating the contents of *block.
	if (block->version > 1)
		return LZMA_OPTIONS_ERROR;

	if ((unsigned int)(block->check) > LZMA_CHECK_ID_MAX
			|| (try_to_compress && block->filters == NULL))
		return LZMA_PROG_ERROR;

	if (!lzma_check_is_supported(block->check))
		return LZMA_UNSUPPORTED_CHECK;

	// Size of a Block has to be a multiple of four, so limit the size
	// here already. This way we don't need to check it again when adding
	// Block Padding.
	out_size -= (out_size - *out_pos) & 3;

	// Get the size of the Check field.
	const size_t check_size = lzma_check_size(block->check);
	assert(check_size != UINT32_MAX);

	// Reserve space for the Check field.
	if (out_size - *out_pos <= check_size)
		return LZMA_BUF_ERROR;

	out_size -= check_size;

	// Initialize block->uncompressed_size and calculate the worst-case
	// value for block->compressed_size.
	block->uncompressed_size = in_size;
	block->compressed_size = lzma2_bound(in_size);
	if (block->compressed_size == 0)
		return LZMA_DATA_ERROR;

	// Do the actual compression.
	lzma_ret ret = LZMA_BUF_ERROR;
	if (try_to_compress)
		ret = block_encode_normal(block, allocator,
				in, in_size, out, out_pos, out_size);

	if (ret != LZMA_OK) {
		// If the error was something else than output buffer
		// becoming full, return the error now.
		if (ret != LZMA_BUF_ERROR)
			return ret;

		// The data was uncompressible (at least with the options
		// given to us) or the output buffer was too small. Use the
		// uncompressed chunks of LZMA2 to wrap the data into a valid
		// Block. If we haven't been given enough output space, even
		// this may fail.
		return_if_error(block_encode_uncompressed(block, in, in_size,
				out, out_pos, out_size));
	}

	assert(*out_pos <= out_size);

	// Block Padding. No buffer overflow here, because we already adjusted
	// out_size so that (out_size - out_start) is a multiple of four.
	// Thus, if the buffer is full, the loop body can never run.
	for (size_t i = (size_t)(block->compressed_size); i & 3; ++i) {
		assert(*out_pos < out_size);
		out[(*out_pos)++] = 0x00;
	}

	// If there's no Check field, we are done now.
	if (check_size > 0) {
		// Calculate the integrity check. We reserved space for
		// the Check field earlier so we don't need to check for
		// available output space here.
		lzma_check_state check;
		lzma_check_init(&check, block->check);
		lzma_check_update(&check, block->check, in, in_size);
		lzma_check_finish(&check, block->check);

		memcpy(block->raw_check, check.buffer.u8, check_size);
		memcpy(out + *out_pos, check.buffer.u8, check_size);
		*out_pos += check_size;
	}

	return LZMA_OK;
}